

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<product,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,function<product_(int)> *f)

{
  function<product_(int)> *method;
  function<product_(int)> local_38;
  jsonrpccxx *local_18;
  function<product_(int)> *f_local;
  
  local_18 = this;
  f_local = (function<product_(int)> *)__return_storage_ptr__;
  std::function<product_(int)>::function(&local_38,(function<product_(int)> *)this);
  methodHandle<product,int>(__return_storage_ptr__,(jsonrpccxx *)&local_38,method);
  std::function<product_(int)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }